

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_walk_node.cpp
# Opt level: O2

void __thiscall random_walk_node::run(random_walk_node *this)

{
  vec3 *pvVar1;
  double dVar2;
  int iVar3;
  result_type rVar4;
  double dVar5;
  vec3 *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uniform_real_distribution<double> randomVel;
  uniform_real_distribution<double> randomZ;
  uniform_real_distribution<double> randomY;
  uniform_real_distribution<double> randomX;
  uniform_real_distribution<double> local_98;
  uniform_real_distribution<double> local_88;
  uniform_real_distribution<double> local_70;
  uniform_real_distribution<double> local_60;
  uniform_real_distribution<double> local_50;
  uniform_real_distribution<double> local_40;
  
  local_40._M_param._M_a = XMIN;
  local_40._M_param._M_b = XMAX;
  local_50._M_param._M_a = YMIN;
  local_50._M_param._M_b = YMAX;
  local_60._M_param._M_a = ZMIN;
  local_60._M_param._M_b = ZMAX;
  local_70._M_param._M_a = VMIN;
  local_70._M_param._M_b = VMAX;
  local_88._M_param._M_a._0_4_ = 0;
  local_88._M_param._M_a._4_4_ = 0;
  local_88._M_param._M_b._0_4_ = 0x54442d18;
  local_88._M_param._M_b._4_4_ = 0x401921fb;
  local_98._M_param._M_a._0_4_ = 0;
  local_98._M_param._M_a._4_4_ = 0;
  local_98._M_param._M_b._0_4_ = 0x54442d18;
  local_98._M_param._M_b._4_4_ = 0x400921fb;
  rVar4 = std::uniform_real_distribution<double>::operator()(&local_40,&e);
  (this->super_node).x = rVar4;
  rVar4 = std::uniform_real_distribution<double>::operator()(&local_50,&e);
  (this->super_node).y = rVar4;
  rVar4 = std::uniform_real_distribution<double>::operator()(&local_60,&e);
  (this->super_node).z = rVar4;
  rVar4 = std::uniform_real_distribution<double>::operator()(&local_70,&e);
  (this->super_node).v = rVar4;
  rVar4 = std::uniform_real_distribution<double>::operator()(&local_88,&e);
  (this->super_node).d = rVar4;
  rVar4 = std::uniform_real_distribution<double>::operator()(&local_98,&e);
  (this->super_node).p = rVar4;
  *(uint *)(usleep + *(long *)(std::cout + -0x18)) =
       *(uint *)(usleep + *(long *)(std::cout + -0x18)) | 4;
  std::chrono::_V2::system_clock::now();
  lVar7 = std::chrono::_V2::system_clock::now();
  std::chrono::_V2::system_clock::now();
  pvVar6 = points;
  dVar2 = (this->super_node).z;
  iVar3 = (this->super_node).id;
  dVar5 = (this->super_node).y;
  pvVar1 = points + iVar3;
  pvVar1->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(float)(this->super_node).x;
  pvVar1->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(float)dVar5;
  pvVar6[iVar3].field_2.z = (float)dVar2;
  node::calc(&this->super_node,(this->super_node).id,(this->super_node).x,(this->super_node).y,
             (this->super_node).z);
  lVar9 = lVar7;
  while (running == true) {
    std::chrono::_V2::system_clock::now();
    lVar8 = std::chrono::_V2::system_clock::now();
    if ((this->super_node).first == true) {
      (this->super_node).first = false;
      lVar7 = lVar8;
      lVar9 = lVar8;
    }
    update(this,((double)(lVar8 - lVar9) / 1000.0) / 1000000.0);
    lVar9 = std::chrono::_V2::system_clock::now();
    lVar8 = std::chrono::_V2::system_clock::now();
    if (interval * 1000000.0 < (double)(lVar8 - lVar7) / 1000.0) {
      rVar4 = std::uniform_real_distribution<double>::operator()(&local_70,&e);
      node::setv(&this->super_node,rVar4);
      rVar4 = std::uniform_real_distribution<double>::operator()(&local_88,&e);
      node::setd(&this->super_node,rVar4);
      rVar4 = std::uniform_real_distribution<double>::operator()(&local_98,&e);
      node::setp(&this->super_node,rVar4);
      (this->super_node).lastErr = 0;
      lVar7 = lVar8;
    }
    usleep(1000);
  }
  return;
}

Assistant:

void random_walk_node::run(){
    uniform_real_distribution<double> randomX(XMIN,XMAX);
    uniform_real_distribution<double> randomY(YMIN,YMAX);
    uniform_real_distribution<double> randomZ(ZMIN,ZMAX);
    uniform_real_distribution<double> randomVel(VMIN,VMAX);
    uniform_real_distribution<double> randomDir(0,2*M_PI);
    uniform_real_distribution<double> randomPitch(0,M_PI);
    x = randomX(e);
    y = randomY(e);
    z = randomZ(e);
    v = randomVel(e);
    d = randomDir(e);
    p = randomPitch(e);
    std::chrono::duration<double, std::micro> tmpTime;     //Time between current and lastshow
    std::chrono::duration<double, std::micro> loopTime;    //Time used for a single loop
    std::chrono::duration<double, std::micro> changeTime;
    std::chrono::duration<double, std::micro> wholeTime;
    high_resolution_clock::time_point loopEndTime;
    cout<<setiosflags(ios::fixed);
    high_resolution_clock::time_point baseTime = high_resolution_clock::now();
    high_resolution_clock::time_point lastChange = high_resolution_clock::now();    //Time when random_walk_node info changed
    high_resolution_clock::time_point  lastUpdate = lastChange;   //Time when random_walk_node loc updated
    high_resolution_clock::time_point lastShow = lastUpdate;    //Time when random_walk_node info shown
    high_resolution_clock::time_point currentTime = high_resolution_clock::now();
    wholeTime = currentTime-baseTime;
    //printf("ID=%d\t\tX=%f\t\tY=%f\t\tZ=%f\n",this->id,this->x,this->y,this->z);
    points[this->id] = glm::vec3(this->x, this->y, this->z);
    calc(this->id, this->x, this->y, this->z);    //这句是将xyz转换为wgs84坐标系
    //initial output
    while(running == true){
        currentTime = high_resolution_clock::now();
        tmpTime = (currentTime-lastShow);
        loopEndTime = high_resolution_clock::now();
        if (first) {
            lastUpdate = loopEndTime;
            lastChange = loopEndTime;
            first = false;
        }
        loopTime=(loopEndTime-lastUpdate);
        this->update(loopTime.count()/1e6);
        lastUpdate = high_resolution_clock::now();
        currentTime = high_resolution_clock::now();
        changeTime = currentTime-lastChange;
        if(changeTime.count() > interval*1e6){       //Regenerate random_walk_node info every $timeout second
            lastChange = currentTime;
            this->setv(randomVel(e));
            this->setd(randomDir(e));
            this->setp(randomPitch(e));
            lastErr = 0;                //To avoid random_walk_node bouncing near the edge
        }
        usleep(1000);
    }
}